

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O0

RC __thiscall
SM_Manager::GetRelEntry(SM_Manager *this,char *relName,RM_Record *relRec,RelCatEntry **entry)

{
  undefined1 local_98 [8];
  RM_FileScan fs;
  RC rc;
  RelCatEntry **entry_local;
  RM_Record *relRec_local;
  char *relName_local;
  SM_Manager *this_local;
  
  fs._92_4_ = 0;
  RM_FileScan::RM_FileScan((RM_FileScan *)local_98);
  fs._92_4_ = RM_FileScan::OpenScan
                        ((RM_FileScan *)local_98,&this->relcatFH,STRING,0x19,0,EQ_OP,relName,NO_HINT
                        );
  this_local._4_4_ = fs._92_4_;
  if (fs._92_4_ == 0) {
    fs._92_4_ = RM_FileScan::GetNextRec((RM_FileScan *)local_98,relRec);
    if (fs._92_4_ == 0) {
      fs._92_4_ = RM_FileScan::CloseScan((RM_FileScan *)local_98);
      this_local._4_4_ = fs._92_4_;
      if ((fs._92_4_ == 0) &&
         (fs._92_4_ = RM_Record::GetData(relRec,(char **)entry), this_local._4_4_ = fs._92_4_,
         fs._92_4_ == 0)) {
        this_local._4_4_ = 0;
      }
    }
    else {
      this_local._4_4_ = 0x12e;
    }
  }
  RM_FileScan::~RM_FileScan((RM_FileScan *)local_98);
  return this_local._4_4_;
}

Assistant:

RC SM_Manager::GetRelEntry(const char *relName, RM_Record &relRec, RelCatEntry *&entry){
  RC rc = 0;
  // Use a scan to search for it
  RM_FileScan fs;
  if((rc = fs.OpenScan(relcatFH, STRING, MAXNAME+1, 0, EQ_OP, const_cast<char*>(relName))))
    return (rc);
  if((rc = fs.GetNextRec(relRec))) // there should be only one entry
    return (SM_BADRELNAME);
  
  if((rc = fs.CloseScan())) 
    return (rc);

  if((rc = relRec.GetData((char *&)entry))) // retrieve its data contents
    return (rc);

  return (0);
}